

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

void Gia_ManArePrintCube(Gia_ManAre_t *p,Gia_StaAre_t *pSta)

{
  uint uVar1;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = 0;
  printf("%4d %4d :  ",(ulong)(uint)p->iStaCur,(ulong)(p->nStas - 1));
  printf("Prev %4d   ",(ulong)((uint)pSta->iPrev & 0x7fffffff));
  printf("%p   ",pSta);
  iVar3 = 0;
  uVar4 = 0;
  uVar6 = 0;
  uVar1 = 0;
  while( true ) {
    p_00 = p->pAig;
    if (p_00->nRegs <= iVar3) break;
    pGVar2 = Gia_ManCo(p_00,(p_00->vCos->nSize - p_00->nRegs) + iVar3);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    if (((uint)(&pSta[1].iPrev)[(int)uVar5 >> 5] >> (uVar5 & 0x1e) & 1) == 0) {
      if (((uint)(&pSta[1].iPrev)[(int)uVar5 >> 5] >> (sbyte)(uVar5 & 0x1e) & 2) == 0) {
        putchar(0x2d);
        uVar1 = uVar1 + 1;
      }
      else {
        putchar(0x31);
        uVar6 = uVar6 + 1;
      }
    }
    else {
      putchar(0x30);
      uVar4 = uVar4 + 1;
    }
    iVar3 = iVar3 + 1;
    uVar5 = uVar5 + 2;
  }
  printf("  0 =%3d",(ulong)uVar4);
  printf("  1 =%3d",(ulong)uVar6);
  printf("  - =%3d",(ulong)uVar1);
  putchar(10);
  return;
}

Assistant:

void Gia_ManArePrintCube( Gia_ManAre_t * p, Gia_StaAre_t * pSta )
{
    Gia_Obj_t * pObj;
    int i, Count0 = 0, Count1 = 0, Count2 = 0;
    printf( "%4d %4d :  ", p->iStaCur, p->nStas-1 );
    printf( "Prev %4d   ", Gia_Ptr2Int(pSta->iPrev) );
    printf( "%p   ", pSta );
    Gia_ManForEachRi( p->pAig, pObj, i )
    {
        if ( Gia_StaHasValue0(pSta, i) )
            printf( "0" ), Count0++;
        else if ( Gia_StaHasValue1(pSta, i) )
            printf( "1" ), Count1++;
        else
            printf( "-" ), Count2++;
    }
    printf( "  0 =%3d", Count0 );
    printf( "  1 =%3d", Count1 );
    printf( "  - =%3d", Count2 );
    printf( "\n" );
}